

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O1

void __thiscall
QAbstractProxyModel::setSourceModel(QAbstractProxyModel *this,QAbstractItemModel *sourceModel)

{
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  *this_00;
  QObject *sender;
  QObject *pQVar1;
  QAbstractItemModel *pQVar2;
  long lVar3;
  long in_FS_OFFSET;
  Connection local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(this + 8);
  this_00 = (QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
             *)(lVar3 + 0xd8);
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::removeBindingUnlessInWrapper(this_00);
  sender = *(QObject **)(lVar3 + 0xd8);
  if (sourceModel == (QAbstractItemModel *)0x0) {
    pQVar1 = &QAbstractItemModelPrivate::staticEmptyModel()->super_QObject;
    if (sender == (QObject *)0x0 || sender == pQVar1) goto LAB_004789a4;
  }
  else if (sender == &sourceModel->super_QObject) goto LAB_004789a4;
  if (sender != (QObject *)0x0) {
    lVar3 = 8;
    do {
      QObject::disconnect(sender,*(char **)((long)&PTR_mapSelectionFromSource_006b2a28 + lVar3),
                          (QObject *)this,
                          *(char **)((long)&setSourceModel::connectionTable[0].signalName + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x78);
  }
  if (sourceModel == (QAbstractItemModel *)0x0) {
    pQVar2 = QAbstractItemModelPrivate::staticEmptyModel();
    (this_00->super_QPropertyData<QAbstractItemModel_*>).val = pQVar2;
  }
  else {
    (this_00->super_QPropertyData<QAbstractItemModel_*>).val = sourceModel;
    lVar3 = 8;
    do {
      QObject::connect((int)&local_40,(sockaddr *)sourceModel,
                       (socklen_t)
                       *(undefined8 *)((long)&PTR_mapSelectionFromSource_006b2a28 + lVar3));
      QMetaObject::Connection::~Connection(&local_40);
      lVar3 = lVar3 + 0x10;
    } while (lVar3 != 0x78);
  }
  QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
  ::notify(this_00);
LAB_004789a4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractProxyModel::setSourceModel(QAbstractItemModel *sourceModel)
{
    Q_D(QAbstractProxyModel);
    d->model.removeBindingUnlessInWrapper();
    // Special case to handle nullptr models. Otherwise we will have unwanted
    // notifications.
    const QAbstractItemModel *currentModel = d->model.valueBypassingBindings();
    if (!sourceModel && currentModel == QAbstractItemModelPrivate::staticEmptyModel())
        return;
    static const struct {
        const char *signalName;
        const char *slotName;
    } connectionTable[] = {
        // clang-format off
        { SIGNAL(destroyed()), SLOT(_q_sourceModelDestroyed()) },
        { SIGNAL(rowsAboutToBeInserted(QModelIndex,int,int)), SLOT(_q_sourceModelRowsAboutToBeInserted(QModelIndex,int,int)) },
        { SIGNAL(rowsInserted(QModelIndex,int,int)), SLOT(_q_sourceModelRowsInserted(QModelIndex,int,int)) },
        { SIGNAL(rowsRemoved(QModelIndex,int,int)), SLOT(_q_sourceModelRowsRemoved(QModelIndex,int,int)) },
        { SIGNAL(columnsAboutToBeInserted(QModelIndex,int,int)), SLOT(_q_sourceModelColumnsAboutToBeInserted(QModelIndex,int,int)) },
        { SIGNAL(columnsInserted(QModelIndex,int,int)), SLOT(_q_sourceModelColumnsInserted(QModelIndex,int,int)) },
        { SIGNAL(columnsRemoved(QModelIndex,int,int)), SLOT(_q_sourceModelColumnsRemoved(QModelIndex,int,int)) }
        // clang-format on
    };

    if (sourceModel != currentModel) {
        if (currentModel) {
            for (const auto &c : connectionTable)
                disconnect(currentModel, c.signalName, this, c.slotName);
        }

        if (sourceModel) {
            d->model.setValueBypassingBindings(sourceModel);
            for (const auto &c : connectionTable)
                connect(sourceModel, c.signalName, this, c.slotName);
        } else {
            d->model.setValueBypassingBindings(QAbstractItemModelPrivate::staticEmptyModel());
        }
        d->model.notify();
    }
}